

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tree_renderer.cpp
# Opt level: O1

yyjson_mut_val * duckdb::RenderRecursive(yyjson_mut_doc *doc,RenderTree *tree,idx_t x,idx_t y)

{
  yyjson_val_pool *pyVar1;
  yyjson_alc *alc;
  yyjson_str_pool *pool;
  pointer pCVar2;
  char *pcVar3;
  long lVar4;
  pointer ppVar5;
  pointer pbVar6;
  optional_ptr<duckdb::RenderTreeNode,_true> oVar7;
  yyjson_mut_val *pyVar8;
  size_t sVar9;
  yyjson_mut_val *pyVar10;
  yyjson_mut_val *pyVar11;
  char *pcVar12;
  yyjson_mut_val *pyVar13;
  yyjson_mut_val *pyVar14;
  Coordinate *child_pos;
  pointer pCVar15;
  ulong uVar16;
  pointer pbVar17;
  bool bVar18;
  pointer local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string local_58;
  optional_ptr<duckdb::RenderTreeNode,_true> node_p;
  
  node_p = RenderTree::GetNode(tree,x,y);
  optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&node_p);
  oVar7.ptr = node_p.ptr;
  if (doc == (yyjson_mut_doc *)0x0) {
LAB_001e611d:
    pyVar13 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar1 = &doc->val_pool;
    if (((doc->val_pool).end != (doc->val_pool).cur) ||
       (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1), bVar18)) {
      pyVar13 = pyVar1->cur;
      pyVar1->cur = pyVar13 + 1;
    }
    else {
      pyVar13 = (yyjson_mut_val *)0x0;
    }
    if (pyVar13 == (yyjson_mut_val *)0x0) goto LAB_001e611d;
    pyVar13->tag = 7;
  }
  if (doc == (yyjson_mut_doc *)0x0) {
LAB_001e6124:
    pyVar14 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar1 = &doc->val_pool;
    if (((doc->val_pool).end != (doc->val_pool).cur) ||
       (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1), bVar18)) {
      pyVar14 = pyVar1->cur;
      pyVar1->cur = pyVar14 + 1;
    }
    else {
      pyVar14 = (yyjson_mut_val *)0x0;
    }
    if (pyVar14 == (yyjson_mut_val *)0x0) goto LAB_001e6124;
    pyVar14->tag = 6;
  }
  pCVar2 = ((oVar7.ptr)->child_positions).
           super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
           .
           super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar15 = ((oVar7.ptr)->child_positions).
                 super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                 .
                 super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                 ._M_impl.super__Vector_impl_data._M_start; pCVar15 != pCVar2; pCVar15 = pCVar15 + 1
      ) {
    pyVar8 = RenderRecursive(doc,tree,pCVar15->x,pCVar15->y);
    if (pyVar14 == (yyjson_mut_val *)0x0) {
      bVar18 = false;
    }
    else {
      bVar18 = (pyVar14->tag & 7) == 6;
    }
    if ((pyVar8 != (yyjson_mut_val *)0x0) && (bVar18)) {
      uVar16 = pyVar14->tag;
      pyVar14->tag = uVar16 + 0x100;
      pyVar10 = pyVar8;
      if (0xff < uVar16) {
        pyVar10 = *(yyjson_mut_val **)((pyVar14->uni).u64 + 0x10);
        *(yyjson_mut_val **)((pyVar14->uni).u64 + 0x10) = pyVar8;
      }
      pyVar8->next = pyVar10;
      (pyVar14->uni).str = (char *)pyVar8;
    }
  }
  if ((((doc != (yyjson_mut_doc *)0x0) && (pyVar13 != (yyjson_mut_val *)0x0)) &&
      (pcVar3 = ((oVar7.ptr)->name)._M_dataplus._M_p, pcVar3 != (char *)0x0)) &&
     ((~(uint)pyVar13->tag & 7) == 0)) {
    pyVar1 = &doc->val_pool;
    if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18)) ||
       (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2), bVar18)) {
      pyVar8 = pyVar1->cur;
      pyVar1->cur = pyVar8 + 2;
    }
    else {
      pyVar8 = (yyjson_mut_val *)0x0;
    }
    if (pyVar8 != (yyjson_mut_val *)0x0) {
      uVar16 = pyVar13->tag;
      pyVar8->tag = 0x40d;
      (pyVar8->uni).str = "name";
      sVar9 = strlen(pcVar3);
      pyVar8[1].tag = sVar9 << 8 | 5;
      pyVar8[1].uni.str = pcVar3;
      pyVar10 = pyVar8;
      if (0xff < uVar16) {
        lVar4 = *(long *)((pyVar13->uni).u64 + 0x10);
        pyVar10 = *(yyjson_mut_val **)(lVar4 + 0x10);
        *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
      }
      pyVar8[1].next = pyVar10;
      pyVar8->next = pyVar8 + 1;
      (pyVar13->uni).str = (char *)pyVar8;
      pyVar13->tag = (ulong)(byte)pyVar13->tag + (uVar16 & 0xffffffffffffff00) + 0x100;
    }
  }
  if (pyVar14 == (yyjson_mut_val *)0x0) {
LAB_001e5aa1:
    if (doc != (yyjson_mut_doc *)0x0) {
      pyVar1 = &doc->val_pool;
      if (((doc->val_pool).end != (doc->val_pool).cur) ||
         (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1), bVar18)) {
        pyVar14 = pyVar1->cur;
        pyVar1->cur = pyVar14 + 1;
      }
      else {
        pyVar14 = (yyjson_mut_val *)0x0;
      }
      if (pyVar14 != (yyjson_mut_val *)0x0) {
        pyVar14->tag = 7;
        goto LAB_001e5ad6;
      }
    }
  }
  else if (doc != (yyjson_mut_doc *)0x0) {
    if ((pyVar13 != (yyjson_mut_val *)0x0) && ((~(uint)pyVar13->tag & 7) == 0)) {
      pyVar1 = &doc->val_pool;
      if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18)) ||
         (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2), bVar18)) {
        pyVar8 = pyVar1->cur;
        pyVar1->cur = pyVar8 + 2;
      }
      else {
        pyVar8 = (yyjson_mut_val *)0x0;
      }
      if (pyVar8 != (yyjson_mut_val *)0x0) {
        uVar16 = pyVar13->tag;
        pyVar8->tag = 0x80d;
        (pyVar8->uni).str = "children";
        pyVar10 = pyVar8;
        if (0xff < uVar16) {
          lVar4 = *(long *)((pyVar13->uni).u64 + 0x10);
          pyVar10 = *(yyjson_mut_val **)(lVar4 + 0x10);
          *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
        }
        pyVar14->next = pyVar10;
        pyVar8->next = pyVar14;
        (pyVar13->uni).str = (char *)pyVar8;
        pyVar13->tag = (ulong)(byte)pyVar13->tag + (uVar16 & 0xffffffffffffff00) + 0x100;
      }
    }
    goto LAB_001e5aa1;
  }
  pyVar14 = (yyjson_mut_val *)0x0;
LAB_001e5ad6:
  local_98 = ((oVar7.ptr)->extra_text).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = ((oVar7.ptr)->extra_text).map.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98 != ppVar5) {
    pyVar1 = &doc->val_pool;
    alc = &doc->alc;
    pool = &doc->str_pool;
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,anon_var_dwarf_647c26b + 8,anon_var_dwarf_647c26b + 9);
      StringUtil::Split(&splits,&local_98->second,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((ulong)((long)splits.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)splits.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        if ((doc != (yyjson_mut_doc *)0x0) &&
           (pcVar3 = (local_98->second)._M_dataplus._M_p, pcVar3 != (char *)0x0)) {
          if (pyVar14 == (yyjson_mut_val *)0x0) {
            bVar18 = false;
          }
          else {
            bVar18 = (~(uint)pyVar14->tag & 7) == 0;
          }
          if ((bVar18) && (pcVar12 = (local_98->first)._M_dataplus._M_p, pcVar12 != (char *)0x0)) {
            if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18)) ||
               (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2), bVar18)) {
              pyVar8 = pyVar1->cur;
              pyVar1->cur = pyVar8 + 2;
            }
            else {
              pyVar8 = (yyjson_mut_val *)0x0;
            }
            if (pyVar8 == (yyjson_mut_val *)0x0) goto LAB_001e5f7d;
            uVar16 = pyVar14->tag;
            pyVar8->tag = 5;
            sVar9 = strlen(pcVar12);
            pyVar8->tag = sVar9 << 8 | 5;
            (pyVar8->uni).str = pcVar12;
            sVar9 = strlen(pcVar3);
            if ((sVar9 < (ulong)((long)(doc->str_pool).end - (long)(doc->str_pool).cur)) ||
               (bVar18 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pool,alc,sVar9 + 1), bVar18)) {
              pcVar12 = pool->cur;
              pool->cur = pcVar12 + sVar9 + 1;
            }
            else {
              pcVar12 = (char *)0x0;
            }
            if (pcVar12 == (char *)0x0) {
              pcVar12 = (char *)0x0;
            }
            else {
              switchD_00b1522a::default(pcVar12,pcVar3,sVar9);
              pcVar12[sVar9] = '\0';
            }
            pyVar8[1].uni.ptr = pcVar12;
            if (pcVar12 == (char *)0x0) goto LAB_001e5f7d;
            pyVar8[1].tag = sVar9 << 8 | 5;
            pyVar10 = pyVar8;
            if (0xff < uVar16) {
              lVar4 = *(long *)((pyVar14->uni).u64 + 0x10);
              pyVar10 = *(yyjson_mut_val **)(lVar4 + 0x10);
              *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
            }
            pyVar8[1].next = pyVar10;
            pyVar8->next = pyVar8 + 1;
            (pyVar14->uni).str = (char *)pyVar8;
LAB_001e5f64:
            pyVar14->tag = (ulong)(byte)pyVar14->tag + (uVar16 & 0xffffffffffffff00) + 0x100;
          }
        }
      }
      else {
        if (doc == (yyjson_mut_doc *)0x0) {
LAB_001e5fba:
          pyVar8 = (yyjson_mut_val *)0x0;
        }
        else {
          if (((doc->val_pool).end != (doc->val_pool).cur) ||
             (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1), bVar18)) {
            pyVar8 = pyVar1->cur;
            pyVar1->cur = pyVar8 + 1;
          }
          else {
            pyVar8 = (yyjson_mut_val *)0x0;
          }
          if (pyVar8 == (yyjson_mut_val *)0x0) goto LAB_001e5fba;
          pyVar8->tag = 6;
        }
        pbVar6 = splits.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (splits.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            splits.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar17 = splits.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if ((pyVar8 != (yyjson_mut_val *)0x0 && doc != (yyjson_mut_doc *)0x0) &&
               ((pyVar8->tag & 7) == 6)) {
              if (doc == (yyjson_mut_doc *)0x0) {
LAB_001e5d09:
                pyVar10 = (yyjson_mut_val *)0x0;
              }
              else {
                pcVar3 = (pbVar17->_M_dataplus)._M_p;
                pyVar10 = (yyjson_mut_val *)0x0;
                if (pcVar3 != (char *)0x0) {
                  sVar9 = strlen(pcVar3);
                  if (((doc->val_pool).end != (doc->val_pool).cur) ||
                     (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1), bVar18)) {
                    pyVar11 = pyVar1->cur;
                    pyVar1->cur = pyVar11 + 1;
                  }
                  else {
                    pyVar11 = (yyjson_mut_val *)0x0;
                  }
                  if ((sVar9 < (ulong)((long)(doc->str_pool).end - (long)(doc->str_pool).cur)) ||
                     (bVar18 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pool,alc,sVar9 + 1),
                     bVar18)) {
                    pcVar12 = pool->cur;
                    pool->cur = pcVar12 + sVar9 + 1;
                  }
                  else {
                    pcVar12 = (char *)0x0;
                  }
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = (char *)0x0;
                  }
                  else {
                    switchD_00b1522a::default(pcVar12,pcVar3,sVar9);
                    pcVar12[sVar9] = '\0';
                  }
                  if (pyVar11 == (yyjson_mut_val *)0x0) goto LAB_001e5d09;
                  pyVar10 = (yyjson_mut_val *)0x0;
                  if (pcVar12 != (char *)0x0) {
                    pyVar11->tag = sVar9 << 8 | 5;
                    (pyVar11->uni).ptr = pcVar12;
                    pyVar10 = pyVar11;
                  }
                }
              }
              if (pyVar8 == (yyjson_mut_val *)0x0) {
                bVar18 = false;
              }
              else {
                bVar18 = (pyVar8->tag & 7) == 6;
              }
              if ((pyVar10 != (yyjson_mut_val *)0x0) && (bVar18)) {
                uVar16 = pyVar8->tag;
                pyVar8->tag = uVar16 + 0x100;
                pyVar11 = pyVar10;
                if (0xff < uVar16) {
                  pyVar11 = *(yyjson_mut_val **)((pyVar8->uni).u64 + 0x10);
                  *(yyjson_mut_val **)((pyVar8->uni).u64 + 0x10) = pyVar10;
                }
                pyVar10->next = pyVar11;
                (pyVar8->uni).u64 = (uint64_t)pyVar10;
              }
            }
            pbVar17 = pbVar17 + 1;
          } while (pbVar17 != pbVar6);
        }
        if ((doc != (yyjson_mut_doc *)0x0) && (pyVar8 != (yyjson_mut_val *)0x0)) {
          if (pyVar14 == (yyjson_mut_val *)0x0) {
            bVar18 = false;
          }
          else {
            bVar18 = (~(uint)pyVar14->tag & 7) == 0;
          }
          if ((bVar18) && (pcVar3 = (local_98->first)._M_dataplus._M_p, pcVar3 != (char *)0x0)) {
            if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18)) ||
               (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2), bVar18)) {
              pyVar10 = pyVar1->cur;
              pyVar1->cur = pyVar10 + 2;
            }
            else {
              pyVar10 = (yyjson_mut_val *)0x0;
            }
            if (pyVar10 != (yyjson_mut_val *)0x0) {
              uVar16 = pyVar14->tag;
              pyVar10->tag = 5;
              sVar9 = strlen(pcVar3);
              pyVar10->tag = sVar9 << 8 | 5;
              (pyVar10->uni).str = pcVar3;
              pyVar11 = pyVar10;
              if (0xff < uVar16) {
                lVar4 = *(long *)((pyVar14->uni).u64 + 0x10);
                pyVar11 = *(yyjson_mut_val **)(lVar4 + 0x10);
                *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar10;
              }
              pyVar8->next = pyVar11;
              pyVar10->next = pyVar8;
              (pyVar14->uni).str = (char *)pyVar10;
              goto LAB_001e5f64;
            }
          }
        }
      }
LAB_001e5f7d:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&splits);
      local_98 = local_98 + 1;
    } while (local_98 != ppVar5);
  }
  if ((((doc != (yyjson_mut_doc *)0x0) && (pyVar13 != (yyjson_mut_val *)0x0)) &&
      (pyVar14 != (yyjson_mut_val *)0x0)) && ((~(uint)pyVar13->tag & 7) == 0)) {
    pyVar1 = &doc->val_pool;
    if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18)) ||
       (bVar18 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2), bVar18)) {
      pyVar8 = pyVar1->cur;
      pyVar1->cur = pyVar8 + 2;
    }
    else {
      pyVar8 = (yyjson_mut_val *)0x0;
    }
    if (pyVar8 != (yyjson_mut_val *)0x0) {
      uVar16 = pyVar13->tag;
      pyVar8->tag = 0xa0d;
      (pyVar8->uni).str = "extra_info";
      pyVar10 = pyVar8;
      if (0xff < uVar16) {
        lVar4 = *(long *)((pyVar13->uni).u64 + 0x10);
        pyVar10 = *(yyjson_mut_val **)(lVar4 + 0x10);
        *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
      }
      pyVar14->next = pyVar10;
      pyVar8->next = pyVar14;
      (pyVar13->uni).str = (char *)pyVar8;
      pyVar13->tag = (ulong)(byte)pyVar13->tag + (uVar16 & 0xffffffffffffff00) + 0x100;
    }
  }
  return pyVar13;
}

Assistant:

static yyjson_mut_val *RenderRecursive(yyjson_mut_doc *doc, RenderTree &tree, idx_t x, idx_t y) {
	auto node_p = tree.GetNode(x, y);
	D_ASSERT(node_p);
	auto &node = *node_p;

	auto object = yyjson_mut_obj(doc);
	auto children = yyjson_mut_arr(doc);
	for (auto &child_pos : node.child_positions) {
		auto child_object = RenderRecursive(doc, tree, child_pos.x, child_pos.y);
		yyjson_mut_arr_append(children, child_object);
	}
	yyjson_mut_obj_add_str(doc, object, "name", node.name.c_str());
	yyjson_mut_obj_add_val(doc, object, "children", children);
	auto extra_info = yyjson_mut_obj(doc);
	for (auto &it : node.extra_text) {
		auto &key = it.first;
		auto &value = it.second;
		auto splits = StringUtil::Split(value, "\n");
		if (splits.size() > 1) {
			auto list_items = yyjson_mut_arr(doc);
			for (auto &split : splits) {
				yyjson_mut_arr_add_strcpy(doc, list_items, split.c_str());
			}
			yyjson_mut_obj_add_val(doc, extra_info, key.c_str(), list_items);
		} else {
			yyjson_mut_obj_add_strcpy(doc, extra_info, key.c_str(), value.c_str());
		}
	}
	yyjson_mut_obj_add_val(doc, object, "extra_info", extra_info);
	return object;
}